

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fl_read_image.cxx
# Opt level: O2

Fl_RGB_Image *
traverse_to_gl_subwindows
          (Fl_Group *g,uchar *p,int x,int y,int w,int h,int alpha,Fl_RGB_Image *full_img)

{
  int iVar1;
  int w_00;
  int iVar2;
  int iVar3;
  int iVar4;
  undefined4 extraout_var;
  Fl_Plugin *pFVar5;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  Fl_Window *pFVar6;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  uchar *puVar7;
  Fl_Widget *pFVar8;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  Fl_RGB_Image *pFVar9;
  undefined4 extraout_var_07;
  undefined4 extraout_var_08;
  int iVar10;
  undefined4 in_register_0000000c;
  undefined4 in_register_00000014;
  undefined4 in_register_00000084;
  int iVar11;
  int n;
  Fl_RGB_Image *local_90;
  uchar *local_70;
  Fl_Plugin_Manager pm;
  
  iVar2 = (*(g->super_Fl_Widget)._vptr_Fl_Widget[9])();
  if (CONCAT44(extraout_var,iVar2) != 0) {
    Fl_Plugin_Manager::Fl_Plugin_Manager(&pm,"fltk:device");
    pFVar5 = Fl_Plugin_Manager::plugin(&pm,"opengl.device.fltk.org");
    local_90 = full_img;
    if (pFVar5 != (Fl_Plugin *)0x0) {
      iVar2 = (*pFVar5->_vptr_Fl_Plugin[5])
                        (pFVar5,g,CONCAT44(in_register_00000014,x),CONCAT44(in_register_0000000c,y),
                         CONCAT44(in_register_00000084,w));
      local_90 = (Fl_RGB_Image *)CONCAT44(extraout_var_00,iVar2);
      if (full_img == (Fl_RGB_Image *)0x0) {
        local_70 = p;
        if (p == (uchar *)0x0) {
          local_70 = (uchar *)operator_new__((long)(int)((4 - (uint)(alpha == 0)) *
                                                         (local_90->super_Fl_Image).w_ *
                                                        (local_90->super_Fl_Image).h_));
        }
        pFVar9 = (Fl_RGB_Image *)operator_new(0x40);
        Fl_RGB_Image::Fl_RGB_Image
                  (pFVar9,local_70,(local_90->super_Fl_Image).w_,(local_90->super_Fl_Image).h_,
                   4 - (uint)(alpha == 0),0);
        if (p == (uchar *)0x0) {
          pFVar9->alloc_array = 1;
        }
        if (alpha != 0) {
          memset(local_70,alpha,
                 (long)((local_90->super_Fl_Image).w_ * (local_90->super_Fl_Image).h_ * 4));
        }
        write_image_inside(pFVar9,local_90,0,0);
        (*(local_90->super_Fl_Image)._vptr_Fl_Image[1])(local_90);
        local_90 = pFVar9;
      }
    }
    Fl_Plugin_Manager::~Fl_Plugin_Manager(&pm);
    if (pFVar5 == (Fl_Plugin *)0x0) {
      return full_img;
    }
    goto LAB_0019e280;
  }
  iVar2 = (*(g->super_Fl_Widget)._vptr_Fl_Widget[8])(g);
  if (CONCAT44(extraout_var_01,iVar2) != 0) {
    puVar7 = p;
    if (full_img == (Fl_RGB_Image *)0x0) {
LAB_0019e139:
      puVar7 = read_win_rectangle(puVar7,x,y,w,h,alpha);
      local_90 = (Fl_RGB_Image *)operator_new(0x40);
      Fl_RGB_Image::Fl_RGB_Image(local_90,puVar7,w,h,4 - (uint)(alpha == 0),0);
      if (p == (uchar *)0x0 || full_img != (Fl_RGB_Image *)0x0) {
        local_90->alloc_array = 1;
      }
      goto LAB_0019e280;
    }
    pFVar6 = Fl_Widget::window(&g->super_Fl_Widget);
    if (pFVar6 != (Fl_Window *)0x0) {
      pFVar6 = Fl_Widget::window(&g->super_Fl_Widget);
      iVar2 = (*(pFVar6->super_Fl_Group).super_Fl_Widget._vptr_Fl_Widget[9])(pFVar6);
      if (CONCAT44(extraout_var_02,iVar2) != 0) {
        iVar2 = (*(g->super_Fl_Widget)._vptr_Fl_Widget[8])(g);
        Fl_Window::make_current((Fl_Window *)CONCAT44(extraout_var_03,iVar2));
        puVar7 = (uchar *)0x0;
        goto LAB_0019e139;
      }
    }
  }
  local_90 = full_img;
LAB_0019e280:
  iVar2 = g->children_;
  if (g->children_ < 1) {
    iVar2 = 0;
  }
  for (n = 0; iVar2 != n; n = n + 1) {
    pFVar8 = Fl_Group::child(g,n);
    if (((pFVar8->flags_ & 2) == 0) &&
       (iVar3 = (*pFVar8->_vptr_Fl_Widget[7])(pFVar8), CONCAT44(extraout_var_04,iVar3) != 0)) {
      iVar3 = (*pFVar8->_vptr_Fl_Widget[8])(pFVar8);
      if (CONCAT44(extraout_var_05,iVar3) == 0) {
        iVar3 = (*pFVar8->_vptr_Fl_Widget[7])(pFVar8);
        traverse_to_gl_subwindows
                  ((Fl_Group *)CONCAT44(extraout_var_08,iVar3),p,x,y,w,h,alpha,local_90);
      }
      else {
        iVar3 = pFVar8->x_;
        iVar10 = pFVar8->y_;
        iVar11 = x;
        if (x < iVar3) {
          iVar11 = iVar3;
        }
        iVar4 = iVar3 - iVar11;
        if (x <= iVar3) {
          iVar4 = 0;
        }
        iVar3 = y;
        if (y < iVar10) {
          iVar3 = iVar10;
        }
        iVar1 = pFVar8->w_;
        w_00 = (w + x) - iVar11;
        if (iVar4 + iVar1 + iVar11 <= w + x) {
          w_00 = iVar4 + iVar1;
        }
        iVar10 = iVar10 + pFVar8->h_;
        iVar4 = iVar10 - iVar3;
        if (iVar3 + iVar1 <= iVar10) {
          iVar4 = iVar1;
        }
        iVar10 = (h + y) - iVar3;
        if (iVar4 + iVar3 <= h + y) {
          iVar10 = iVar4;
        }
        if ((0 < w_00) && (0 < iVar10)) {
          iVar4 = (*pFVar8->_vptr_Fl_Widget[8])(pFVar8);
          pFVar9 = traverse_to_gl_subwindows
                             ((Fl_Group *)CONCAT44(extraout_var_06,iVar4),p,iVar11 - pFVar8->x_,
                              iVar3 - pFVar8->y_,w_00,iVar10,alpha,local_90);
          if (pFVar9 != local_90) {
            iVar10 = (*pFVar8->_vptr_Fl_Widget[9])(pFVar8);
            if (CONCAT44(extraout_var_07,iVar10) == 0) {
              iVar3 = ((local_90->super_Fl_Image).h_ + y) - (iVar3 + (pFVar9->super_Fl_Image).h_);
            }
            else {
              iVar3 = iVar3 - y;
            }
            write_image_inside(local_90,pFVar9,iVar11 - x,iVar3);
            if (pFVar9 != (Fl_RGB_Image *)0x0) {
              (*(pFVar9->super_Fl_Image)._vptr_Fl_Image[1])(pFVar9);
            }
          }
        }
      }
    }
  }
  return local_90;
}

Assistant:

static Fl_RGB_Image *traverse_to_gl_subwindows(Fl_Group *g, uchar *p, int x, int y, int w, int h, int alpha,
                                               Fl_RGB_Image *full_img)
{
  if ( g->as_gl_window() ) {
    Fl_Plugin_Manager pm("fltk:device");
    Fl_Device_Plugin *pi = (Fl_Device_Plugin*)pm.plugin("opengl.device.fltk.org");
    if (!pi) return full_img;
    Fl_RGB_Image *img = pi->rectangle_capture(g, x, y, w, h); // bottom to top image
    if (full_img) full_img = img; // top and bottom will be exchanged later
    else { // exchange top and bottom to get a proper FLTK image
      uchar *data = ( p ? p : new uchar[img->w() * img->h() * (alpha?4:3)] );
      full_img = new Fl_RGB_Image(data, img->w(), img->h(), alpha?4:3);
      if (!p) full_img->alloc_array = 1;
      if (alpha) memset(data, alpha, img->w() * img->h() * 4);
      write_image_inside(full_img, img, 0, 0);
      delete img;
    }
  }
  else if ( g->as_window() && (!full_img || (g->window() && g->window()->as_gl_window())) ) {
    // the starting window or one inside a GL window
    if (full_img) g->as_window()->make_current();
    uchar *image_data;
    int alloc_img = (full_img != NULL || p == NULL); // false means use p, don't alloc new memory for image
#ifdef __APPLE_CC__
    // on Darwin + X11, read_win_rectangle() sometimes returns NULL when there are subwindows
    do image_data = read_win_rectangle( (alloc_img ? NULL : p), x, y, w, h, alpha); while (!image_data);
#else
    image_data = read_win_rectangle( (alloc_img ? NULL : p), x, y, w, h, alpha);
#endif
    full_img = new Fl_RGB_Image(image_data, w, h, alpha?4:3);
    if (alloc_img) full_img->alloc_array = 1;
  }
  int n = g->children();
  for (int i = 0; i < n; i++) {
    Fl_Widget *c = g->child(i);
    if ( !c->visible() || !c->as_group()) continue;
    if ( c->as_window() ) {
      int origin_x = x; // compute intersection of x,y,w,h and the c window
      if (x < c->x()) origin_x = c->x();
      int origin_y = y;
      if (y < c->y()) origin_y = c->y();
      int width = c->w();
      if (origin_x + width > c->x() + c->w()) width = c->x() + c->w() - origin_x;
      if (origin_x + width > x + w) width = x + w - origin_x;
      int height = c->w();
      if (origin_y + height > c->y() + c->h()) height = c->y() + c->h() - origin_y;
      if (origin_y + height > y + h) height = y + h - origin_y;
      if (width > 0 && height > 0) {
        Fl_RGB_Image *img = traverse_to_gl_subwindows(c->as_window(), p, origin_x - c->x(),
                                                      origin_y - c->y(), width, height, alpha, full_img);
        if (img == full_img) continue;
        int top;
        if (c->as_gl_window()) {
          top = origin_y - y;
        } else {
          top = full_img->h() - (origin_y - y + img->h());
        }
        write_image_inside(full_img, img, origin_x - x, top);
        delete img;
      }
    }
    else traverse_to_gl_subwindows(c->as_group(), p, x, y, w, h, alpha, full_img);
  }
  return full_img;
}